

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::FilterCase::callback
          (FilterCase *this,GLenum source,GLenum type,GLuint id,GLenum severity,string *message)

{
  vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
  *this_00;
  MessageID local_64;
  MessageData local_58;
  string *local_28;
  string *message_local;
  GLenum severity_local;
  GLuint id_local;
  GLenum type_local;
  GLenum source_local;
  FilterCase *this_local;
  
  if (this->m_currentErrors !=
      (vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
       *)0x0) {
    this_00 = this->m_currentErrors;
    local_28 = message;
    message_local._0_4_ = severity;
    message_local._4_4_ = id;
    severity_local = type;
    id_local = source;
    _type_local = this;
    MessageID::MessageID(&local_64,source,type,id);
    MessageData::MessageData(&local_58,&local_64,(GLenum)message_local,local_28);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
    ::push_back(this_00,&local_58);
    MessageData::~MessageData(&local_58);
  }
  return;
}

Assistant:

void FilterCase::callback (GLenum source, GLenum type, GLuint id, GLenum severity, const string& message)
{
	if (m_currentErrors)
		m_currentErrors->push_back(MessageData(MessageID(source, type, id), severity, message));
}